

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O1

QTimeZonePrivate * newBackendTimeZone(QByteArray *ianaId)

{
  QTzTimeZonePrivate *this;
  
  this = (QTzTimeZonePrivate *)operator_new(0x98);
  QTzTimeZonePrivate::QTzTimeZonePrivate(this,ianaId);
  return &this->super_QTimeZonePrivate;
}

Assistant:

static QTimeZonePrivate *newBackendTimeZone(const QByteArray &ianaId)
{
    Q_ASSERT(!ianaId.isEmpty());
#if QT_CONFIG(timezone_tzdb)
    return new QChronoTimeZonePrivate(ianaId);
#elif defined(Q_OS_DARWIN)
    return new QMacTimeZonePrivate(ianaId);
#elif defined(Q_OS_ANDROID)
    return new QAndroidTimeZonePrivate(ianaId);
#elif defined(Q_OS_UNIX)
    return new QTzTimeZonePrivate(ianaId);
#elif QT_CONFIG(icu)
    return new QIcuTimeZonePrivate(ianaId);
#elif defined(Q_OS_WIN)
    return new QWinTimeZonePrivate(ianaId);
#else
    return new QUtcTimeZonePrivate(ianaId);
#endif // Backend selection
}